

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::GrowVertexEdgeArray(ON_SubDHeap *this,ON_SubDVertex *v,size_t capacity)

{
  ON__UINT_PTR *pOVar1;
  ON__UINT_PTR *a;
  size_t capacity_local;
  ON_SubDVertex *v_local;
  ON_SubDHeap *this_local;
  
  a = (ON__UINT_PTR *)capacity;
  capacity_local = (size_t)v;
  v_local = (ON_SubDVertex *)this;
  if (v == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    if (capacity == 0) {
      a = (ON__UINT_PTR *)(long)(int)(v->m_edge_count + 1);
    }
    if ((ON__UINT_PTR *)(ulong)v->m_edge_capacity < a) {
      pOVar1 = ResizeArray(this,(ulong)v->m_edge_count,(ulong)v->m_edge_capacity,&v->m_edges->m_ptr,
                           (size_t *)&a);
      if (pOVar1 == (ON__UINT_PTR *)0x0) {
        *(undefined2 *)(capacity_local + 0x68) = 0;
        *(undefined2 *)(capacity_local + 0x6c) = 0;
        *(undefined8 *)(capacity_local + 0x70) = 0;
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        *(ON__UINT_PTR **)(capacity_local + 0x70) = pOVar1;
        *(short *)(capacity_local + 0x6c) = (short)a;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::GrowVertexEdgeArray(
  ON_SubDVertex* v,
  size_t capacity
  )
{
  if ( nullptr == v)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == capacity )
    capacity = v->m_edge_count+1;
  if ( capacity <= v->m_edge_capacity)
    return true;
  ON__UINT_PTR* a = ResizeArray(v->m_edge_count,v->m_edge_capacity,(ON__UINT_PTR*)v->m_edges,&capacity);
  if ( nullptr == a )
  {
    v->m_edge_count = 0;
    v->m_edge_capacity = 0;
    v->m_edges = 0;
    return ON_SUBD_RETURN_ERROR(false);
  }
  v->m_edges = (ON_SubDEdgePtr*)a;
  v->m_edge_capacity = (unsigned short)capacity;
  return true;
}